

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.c
# Opt level: O3

_Bool golf_bvh_ray_test(golf_bvh_t *bvh,vec3 ro,vec3 rd,float *t,int *idx,golf_bvh_face_t *face)

{
  _Bool _Var1;
  
  _Var1 = _golf_bvh_ray_test(bvh,bvh->parent,ro,rd,t,idx,face);
  return _Var1;
}

Assistant:

static bool _golf_bvh_ray_test(golf_bvh_t *bvh, int node_idx, vec3 ro, vec3 rd, float *t, int *idx, golf_bvh_face_t *face) {
    if (node_idx < 0) {
        return false;
    }

    golf_bvh_node_t *node = _get_node(bvh, node_idx);

    float t0;
    if (!ray_intersect_aabb(ro, rd, node->aabb.min, node->aabb.max, &t0)) {
        return false;
    }

    if (node->is_leaf) {
        golf_bvh_node_info_t info = node->leaf_node_info;

        *t = FLT_MAX;
        *idx = -1;

        for (int i = 0; i < info.face_count; i++) {
            int face_idx = info.face_start + i; 
            golf_bvh_face_t hit_face = bvh->faces.data[face_idx];
            vec3 triangle_points[3] = { hit_face.a, hit_face.b, hit_face.c };

            float t0;
            int idx0;
            if (ray_intersect_triangles(ro, rd, triangle_points, 3, &t0, &idx0)) {
                if (t0 < *t) {
                    if (face) {
                        *face = hit_face;
                    }
                    *t = t0;
                    *idx = info.idx;
                }
            }
        }

        return *t < FLT_MAX;
    }
    else {
        float t_left;
        int idx_left;
        golf_bvh_face_t left_face;
        bool left_test = _golf_bvh_ray_test(bvh, node->left, ro, rd, &t_left, &idx_left, &left_face);

        float t_right;
        int idx_right;
        golf_bvh_face_t right_face;
        bool right_test = _golf_bvh_ray_test(bvh, node->right, ro, rd, &t_right, &idx_right, &right_face);

        if (left_test && right_test) {
            if (t_left < t_right) {
                *t = t_left;
                *idx = idx_left;
                if (face) *face = left_face;
            }
            else {
                *t = t_right;
                *idx = idx_right;
                if (face) *face = right_face;
            }
            return true;
        }
        else if (left_test && !right_test) {
            *t = t_left;
            *idx = idx_left;
            if (face) *face = left_face;
            return true;
        }
        else if (!left_test && right_test) {
            *t = t_right;
            *idx = idx_right;
            if (face) *face = right_face;
            return true;
        }
        else {
            return false;
        }
    }
}